

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-stats.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_34::BinaryReaderOpcnt::OnOpcodeUint32Uint32
          (BinaryReaderOpcnt *this,uint32_t value0,uint32_t value1)

{
  pair<std::_Rb_tree_iterator<std::pair<const_wabt::OpcodeInfo,_unsigned_long>_>,_bool> pVar1;
  uint32_t array [2];
  _Head_base<0UL,_int,_false> local_24;
  uint32_t local_20;
  uint32_t local_1c;
  tuple<wabt::Opcode,_wabt::OpcodeInfo::Kind,_unsigned_int_*,_int> local_18;
  
  local_18.super__Tuple_impl<0UL,_wabt::Opcode,_wabt::OpcodeInfo::Kind,_unsigned_int_*,_int>.
  super__Tuple_impl<1UL,_wabt::OpcodeInfo::Kind,_unsigned_int_*,_int>.
  super__Tuple_impl<2UL,_unsigned_int_*,_int>.super__Head_base<2UL,_unsigned_int_*,_false>.
  _M_head_impl = &local_20;
  local_18.super__Tuple_impl<0UL,_wabt::Opcode,_wabt::OpcodeInfo::Kind,_unsigned_int_*,_int>.
  super__Tuple_impl<1UL,_wabt::OpcodeInfo::Kind,_unsigned_int_*,_int>.
  super__Tuple_impl<2UL,_unsigned_int_*,_int>.super__Tuple_impl<3UL,_int>.
  super__Head_base<3UL,_int,_false>._M_head_impl = (_Head_base<3UL,_int,_false>)2;
  local_18.super__Tuple_impl<0UL,_wabt::Opcode,_wabt::OpcodeInfo::Kind,_unsigned_int_*,_int>.
  super__Tuple_impl<1UL,_wabt::OpcodeInfo::Kind,_unsigned_int_*,_int>.
  super__Head_base<1UL,_wabt::OpcodeInfo::Kind,_false>._M_head_impl = Uint32Uint32;
  local_18.super__Tuple_impl<0UL,_wabt::Opcode,_wabt::OpcodeInfo::Kind,_unsigned_int_*,_int>.
  super__Tuple_impl<1UL,_wabt::OpcodeInfo::Kind,_unsigned_int_*,_int>._20_4_ =
       (this->current_opcode_).enum_;
  local_24._M_head_impl = 0;
  local_20 = value0;
  local_1c = value1;
  pVar1 = std::
          _Rb_tree<wabt::OpcodeInfo,std::pair<wabt::OpcodeInfo_const,unsigned_long>,std::_Select1st<std::pair<wabt::OpcodeInfo_const,unsigned_long>>,std::less<wabt::OpcodeInfo>,std::allocator<std::pair<wabt::OpcodeInfo_const,unsigned_long>>>
          ::
          _M_emplace_unique<std::piecewise_construct_t_const&,std::tuple<wabt::Opcode,wabt::OpcodeInfo::Kind,unsigned_int*,int>,std::tuple<int>>
                    ((_Rb_tree<wabt::OpcodeInfo,std::pair<wabt::OpcodeInfo_const,unsigned_long>,std::_Select1st<std::pair<wabt::OpcodeInfo_const,unsigned_long>>,std::less<wabt::OpcodeInfo>,std::allocator<std::pair<wabt::OpcodeInfo_const,unsigned_long>>>
                      *)this->opcode_counts_,(piecewise_construct_t *)&std::piecewise_construct,
                     &local_18,(tuple<int> *)&local_24);
  *(long *)(pVar1.first._M_node._M_node + 2) = *(long *)(pVar1.first._M_node._M_node + 2) + 1;
  return (Result)Ok;
}

Assistant:

Result BinaryReaderOpcnt::OnOpcodeUint32Uint32(uint32_t value0,
                                               uint32_t value1) {
  uint32_t array[2] = {value0, value1};
  return Emplace(current_opcode_, OpcodeInfo::Kind::Uint32Uint32, array, 2);
}